

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldsInDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  allocator local_49;
  code *local_48;
  undefined8 uStack_40;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"fields",&local_49);
  local_48 = Descriptor::field;
  uStack_40 = 0;
  PrintFieldDescriptorsInDescriptor(this,message_descriptor,false,&local_38,0x2c6b64,0);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Generator::PrintFieldsInDescriptor(
    const Descriptor& message_descriptor) const {
  const bool is_extension = false;
  PrintFieldDescriptorsInDescriptor(message_descriptor, is_extension, "fields",
                                    &Descriptor::field_count,
                                    &Descriptor::field);
}